

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  ostream *poVar1;
  long lVar2;
  uint port;
  uint uVar3;
  int iVar4;
  char *pcVar5;
  char *endp;
  string proxyhost;
  UdpListeningReceiveSocket s;
  IpEndpointName local_468;
  ProxyListener listener;
  
  if (argc < 2) {
    poVar1 = std::operator<<((ostream *)&std::cerr,"OscProxy listenport [proxyhost proxyport]");
    std::endl<char,std::char_traits<char>>(poVar1);
    return -1;
  }
  lVar2 = strtol(argv[1],&endp,10);
  proxyhost._M_dataplus._M_p = (pointer)&proxyhost.field_2;
  proxyhost._M_string_length = 0;
  proxyhost.field_2._M_local_buf[0] = '\0';
  uVar3 = (uint)lVar2;
  port = uVar3;
  if ((argc != 2) && (std::__cxx11::string::assign((char *)&proxyhost), 3 < (uint)argc)) {
    lVar2 = strtol(argv[3],&endp,10);
    port = (uint)lVar2;
  }
  if (uVar3 == 0) {
    pcVar5 = "invalid listenport";
  }
  else {
    if (port != 0) {
      ProxyListener::ProxyListener(&listener,&proxyhost,port);
      local_468.address = 0xffffffff;
      local_468.port = uVar3;
      UdpListeningReceiveSocket::UdpListeningReceiveSocket
                (&s,&local_468,(PacketListener *)&listener);
      poVar1 = std::operator<<((ostream *)&std::cout,"press ctrl-c to end");
      std::endl<char,std::char_traits<char>>(poVar1);
      SocketReceiveMultiplexer::RunUntilSigInt(&s.mux_);
      UdpListeningReceiveSocket::~UdpListeningReceiveSocket(&s);
      ProxyListener::~ProxyListener(&listener);
      iVar4 = 0;
      goto LAB_001035c3;
    }
    pcVar5 = "invalid proxyport";
  }
  poVar1 = std::operator<<((ostream *)&std::cerr,pcVar5);
  std::endl<char,std::char_traits<char>>(poVar1);
  iVar4 = -1;
LAB_001035c3:
  std::__cxx11::string::~string((string *)&proxyhost);
  return iVar4;
}

Assistant:

int main(int argc, char *argv[]) {
    (void) argc; // suppress unused parameter warnings
    (void) argv; // suppress unused parameter warnings
    if (argc < 2) {
        std::cerr << "OscProxy listenport [proxyhost proxyport]" << std::endl;
        return -1;
    }
    char *endp;
    auto listenport = (unsigned) std::strtol(argv[1], &endp, 10);

    std::string proxyhost;
    if (argc > 2) proxyhost = argv[2];

    unsigned proxyport = listenport;
    if (argc > 3) proxyport =  (unsigned) std::strtol(argv[3], &endp, 10);

    if (listenport == 0) {
        std::cerr << "invalid listenport" << std::endl;
        return -1;
    }

    if (proxyport == 0) {
        std::cerr << "invalid proxyport" << std::endl;
        return -1;
    }

    ProxyListener listener(proxyhost, proxyport);

    UdpListeningReceiveSocket s(
            IpEndpointName(IpEndpointName::ANY_ADDRESS, listenport),
            &listener);

    std::cout << "press ctrl-c to end" << std::endl;

    s.RunUntilSigInt();

    return 0;
}